

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void jsonReturnFromBlob(JsonParse *pParse,u32 i,sqlite3_context *pCtx,int textOnly)

{
  u8 *puVar1;
  bool bVar2;
  u32 uVar3;
  char *pcVar4;
  void *pvVar5;
  int in_ECX;
  ulong uVar6;
  sqlite3_context *in_RDX;
  uint in_ESI;
  JsonParse *in_RDI;
  long in_FS_OFFSET;
  int flags;
  u32 szEscape;
  char c;
  u32 nOut;
  char *zOut;
  char *z_2;
  u32 iOut;
  u32 iIn;
  char *z_1;
  char x;
  int bNeg;
  char *z;
  sqlite3 *db;
  int rc;
  u32 n;
  u32 v;
  double r;
  sqlite3_int64 iRes;
  u32 sz;
  undefined4 in_stack_ffffffffffffff38;
  u32 in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  uint n_00;
  sqlite3 *in_stack_ffffffffffffff48;
  sqlite3 *in_stack_ffffffffffffff50;
  u32 *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  u32 in_stack_ffffffffffffff6c;
  uint local_78;
  uint local_74;
  u8 in_stack_ffffffffffffffb3;
  int iVar7;
  u32 local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0xaaaaaaaa;
  iVar7 = -0x55555556;
  sqlite3_context_db_handle(in_RDX);
  uVar3 = jsonbPayloadSize(in_RDI,in_ESI,&local_c);
  if (uVar3 == 0) {
    sqlite3_result_error
              ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
               (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
    goto LAB_00239074;
  }
  uVar6 = (ulong)(in_RDI->aBlob[in_ESI] & 0xf);
  switch(uVar6) {
  case 0:
    if (local_c == 0) {
      sqlite3_result_null((sqlite3_context *)0x23894c);
      goto LAB_00239074;
    }
    break;
  case 1:
    if (local_c == 0) {
      sqlite3_result_int((sqlite3_context *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      goto LAB_00239074;
    }
    break;
  case 2:
    if (local_c == 0) {
      sqlite3_result_int((sqlite3_context *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff3c);
      goto LAB_00239074;
    }
    break;
  case 3:
  case 4:
    bVar2 = false;
    if (local_c != 0) {
      if (in_RDI->aBlob[in_ESI + uVar3] == '-') {
        if (local_c < 2) break;
        uVar3 = uVar3 + 1;
        local_c = local_c - 1;
        bVar2 = true;
      }
      pcVar4 = sqlite3DbStrNDup(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      if (pcVar4 == (char *)0x0) goto LAB_0023904c;
      iVar7 = sqlite3DecOrHexToI64
                        ((char *)in_stack_ffffffffffffff58,(i64 *)in_stack_ffffffffffffff50);
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (iVar7 == 0) {
        sqlite3_result_int64
                  ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        goto LAB_00239074;
      }
      if ((iVar7 == 3) && (bVar2)) {
        sqlite3_result_int64
                  ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        goto LAB_00239074;
      }
      if (iVar7 != 1) {
        if (bVar2) {
          uVar3 = uVar3 - 1;
          local_c = local_c + 1;
        }
        goto LAB_00238b7d;
      }
    }
    break;
  case 5:
  case 6:
    if (local_c != 0) {
LAB_00238b7d:
      pcVar4 = sqlite3DbStrNDup(in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      if (pcVar4 == (char *)0x0) goto LAB_0023904c;
      sqlite3Strlen30((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      iVar7 = sqlite3AtoF((char *)in_RDX,(double *)CONCAT44(in_ECX,uVar3),iVar7,
                          in_stack_ffffffffffffffb3);
      sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                    (void *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      if (0 < iVar7) {
        sqlite3_result_double
                  ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (double)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        goto LAB_00239074;
      }
    }
    break;
  case 7:
  case 10:
    sqlite3_result_text((sqlite3_context *)in_stack_ffffffffffffff50,
                        (char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                        (_func_void_void_ptr *)
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    goto LAB_00239074;
  case 8:
  case 9:
    puVar1 = in_RDI->aBlob;
    pvVar5 = sqlite3DbMallocRaw(in_stack_ffffffffffffff48,
                                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (pvVar5 != (void *)0x0) {
      local_78 = 0;
      for (local_74 = 0; local_74 < local_c; local_74 = local_74 + 1) {
        if (puVar1[(ulong)local_74 + (ulong)(in_ESI + uVar3)] == '\\') {
          in_stack_ffffffffffffff6c =
               jsonUnescapeOneChar((char *)CONCAT44(in_stack_ffffffffffffff6c,
                                                    in_stack_ffffffffffffff68),(u32)(uVar6 >> 0x20),
                                   in_stack_ffffffffffffff58);
          *(undefined1 *)((long)pvVar5 + (ulong)local_78) = 0xfa;
          *(undefined1 *)((long)pvVar5 + (ulong)(local_78 + 1)) = 0xaa;
          *(undefined1 *)((long)pvVar5 + (ulong)(local_78 + 2)) = 0xaa;
          *(undefined1 *)((long)pvVar5 + (ulong)(local_78 + 3)) = 0xaa;
          local_74 = (in_stack_ffffffffffffff6c - 1) + local_74;
          local_78 = local_78 + 4;
        }
        else {
          *(u8 *)((long)pvVar5 + (ulong)local_78) =
               puVar1[(ulong)local_74 + (ulong)(in_ESI + uVar3)];
          local_78 = local_78 + 1;
        }
      }
      *(undefined1 *)((long)pvVar5 + (ulong)local_78) = 0;
      sqlite3_result_text((sqlite3_context *)in_stack_ffffffffffffff50,
                          (char *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff44,
                          (_func_void_void_ptr *)
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      goto LAB_00239074;
    }
LAB_0023904c:
    sqlite3_result_error_nomem((sqlite3_context *)0x239059);
    goto LAB_00239074;
  case 0xb:
  case 0xc:
    if (in_ECX == 0) {
      pvVar5 = sqlite3_user_data(in_RDX);
      n_00 = (uint)pvVar5;
    }
    else {
      n_00 = 0;
    }
    if ((n_00 & 8) == 0) {
      jsonReturnTextJsonFromBlob
                ((sqlite3_context *)in_stack_ffffffffffffff48,
                 (u8 *)CONCAT44(n_00,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
    }
    else {
      sqlite3_result_blob((sqlite3_context *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                          n_00,(_func_void_void_ptr *)
                               CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    }
    goto LAB_00239074;
  }
  sqlite3_result_error
            ((sqlite3_context *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
LAB_00239074:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void jsonReturnFromBlob(
  JsonParse *pParse,          /* Complete JSON parse tree */
  u32 i,                      /* Index of the node */
  sqlite3_context *pCtx,      /* Return value for this function */
  int textOnly                /* return text JSON.  Disregard user-data */
){
  u32 n, sz;
  int rc;
  sqlite3 *db = sqlite3_context_db_handle(pCtx);

  n = jsonbPayloadSize(pParse, i, &sz);
  if( n==0 ){
    sqlite3_result_error(pCtx, "malformed JSON", -1);
    return;
  }
  switch( pParse->aBlob[i] & 0x0f ){
    case JSONB_NULL: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_null(pCtx);
      break;
    }
    case JSONB_TRUE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSONB_FALSE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSONB_INT5:
    case JSONB_INT: {
      sqlite3_int64 iRes = 0;
      char *z;
      int bNeg = 0;
      char x;
      if( sz==0 ) goto returnfromblob_malformed;
      x = (char)pParse->aBlob[i+n];
      if( x=='-' ){
        if( sz<2 ) goto returnfromblob_malformed;
        n++;
        sz--;
        bNeg = 1;
      }
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3DecOrHexToI64(z, &iRes);
      sqlite3DbFree(db, z);
      if( rc==0 ){
        sqlite3_result_int64(pCtx, bNeg ? -iRes : iRes);
      }else if( rc==3 && bNeg ){
        sqlite3_result_int64(pCtx, SMALLEST_INT64);
      }else if( rc==1 ){
        goto returnfromblob_malformed;
      }else{
        if( bNeg ){ n--; sz++; }
        goto to_double;
      }
      break;
    }
    case JSONB_FLOAT5:
    case JSONB_FLOAT: {
      double r;
      char *z;
      if( sz==0 ) goto returnfromblob_malformed;
    to_double:
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
      sqlite3DbFree(db, z);
      if( rc<=0 ) goto returnfromblob_malformed;
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSONB_TEXTRAW:
    case JSONB_TEXT: {
      sqlite3_result_text(pCtx, (char*)&pParse->aBlob[i+n], sz,
                          SQLITE_TRANSIENT);
      break;
    }
    case JSONB_TEXT5:
    case JSONB_TEXTJ: {
      /* Translate JSON formatted string into raw text */
      u32 iIn, iOut;
      const char *z;
      char *zOut;
      u32 nOut = sz;
      z = (const char*)&pParse->aBlob[i+n];
      zOut = sqlite3DbMallocRaw(db, nOut+1);
      if( zOut==0 ) goto returnfromblob_oom;
      for(iIn=iOut=0; iIn<sz; iIn++){
        char c = z[iIn];
        if( c=='\\' ){
          u32 v;
          u32 szEscape = jsonUnescapeOneChar(&z[iIn], sz-iIn, &v);
          if( v<=0x7f ){
            zOut[iOut++] = (char)v;
          }else if( v<=0x7ff ){
            assert( szEscape>=2 );
            zOut[iOut++] = (char)(0xc0 | (v>>6));
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v<0x10000 ){
            assert( szEscape>=3 );
            zOut[iOut++] = 0xe0 | (v>>12);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v==JSON_INVALID_CHAR ){
            /* Silently ignore illegal unicode */
          }else{
            assert( szEscape>=4 );
            zOut[iOut++] = 0xf0 | (v>>18);
            zOut[iOut++] = 0x80 | ((v>>12)&0x3f);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }
          iIn += szEscape - 1;
        }else{
          zOut[iOut++] = c;
        }
      } /* end for() */
      assert( iOut<=nOut );
      zOut[iOut] = 0;
      sqlite3_result_text(pCtx, zOut, iOut, SQLITE_DYNAMIC);
      break;
    }
    case JSONB_ARRAY:
    case JSONB_OBJECT: {
      int flags = textOnly ? 0 : SQLITE_PTR_TO_INT(sqlite3_user_data(pCtx));
      if( flags & JSON_BLOB ){
        sqlite3_result_blob(pCtx, &pParse->aBlob[i], sz+n, SQLITE_TRANSIENT);
      }else{
        jsonReturnTextJsonFromBlob(pCtx, &pParse->aBlob[i], sz+n);
      }
      break;
    }
    default: {
      goto returnfromblob_malformed;
    }
  }
  return;

returnfromblob_oom:
  sqlite3_result_error_nomem(pCtx);
  return;

returnfromblob_malformed:
  sqlite3_result_error(pCtx, "malformed JSON", -1);
  return;
}